

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cc
# Opt level: O3

void __thiscall
gss::UnsupportedConfiguration::UnsupportedConfiguration
          (UnsupportedConfiguration *this,string *message)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__UnsupportedConfiguration_00160768;
  (this->_what)._M_dataplus._M_p = (pointer)&(this->_what).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_what,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

UnsupportedConfiguration::UnsupportedConfiguration(const string & message) noexcept :
    _what(message)
{
}